

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

char * __thiscall CClient::DemoPlayer_Play(CClient *this,char *pFilename,int StorageType)

{
  uint uVar1;
  IGameClient *pIVar2;
  CClient *pCVar3;
  CPlaybackInfo *pCVar4;
  undefined4 in_EDX;
  CClient *in_RSI;
  CClient *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  char *in_stack_00000008;
  CDemoPlayer *in_stack_00000010;
  uint Crc;
  char *pError;
  CDemoPlayer *block;
  int WantedCrc;
  CClient *pWantedSha256;
  char *in_stack_fffffffffffffff8;
  
  pWantedSha256 = in_RDI;
  (*(in_RDI->super_IClient).super_IInterface._vptr_IInterface[3])();
  CNetClient::ResetErrorString((CNetClient *)0x1270e5);
  CDemoPlayer::SetListener(&in_RDI->m_DemoPlayer,&in_RDI->super_IListener);
  block = &in_RDI->m_DemoPlayer;
  pCVar3 = in_RSI;
  pIVar2 = GameClient(in_RDI);
  WantedCrc = (int)((ulong)pCVar3 >> 0x20);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x13])();
  pCVar3 = (CClient *)
           CDemoPlayer::Load(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,
                             in_stack_fffffffffffffff8);
  if (pCVar3 == (CClient *)0x0) {
    pCVar4 = CDemoPlayer::Info(&in_RDI->m_DemoPlayer);
    uVar1 = bytes_be_to_uint((pCVar4->m_Header).m_aMapCrc);
    CDemoPlayer::Info(&in_RDI->m_DemoPlayer);
    pCVar3 = (CClient *)
             LoadMapSearch((CClient *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                           in_stack_fffffffffffffff8,(SHA256_DIGEST *)pWantedSha256,WantedCrc);
    if (pCVar3 == (CClient *)0x0) {
      pIVar2 = GameClient(in_RDI);
      (*(pIVar2->super_IInterface)._vptr_IInterface[0xc])();
      mem_zero(block,(uint)((ulong)in_RDI >> 0x20));
      in_RDI->m_aSnapshots[0] = in_RDI->m_aDemorecSnapshotHolders;
      in_RDI->m_aSnapshots[1] = in_RDI->m_aDemorecSnapshotHolders + 1;
      in_RDI->m_aSnapshots[0]->m_pSnap = (CSnapshot *)in_RDI->m_aDemorecSnapshotData;
      in_RDI->m_aSnapshots[0]->m_pAltSnap = (CSnapshot *)(in_RDI->m_aDemorecSnapshotData[0] + 1);
      in_RDI->m_aSnapshots[0]->m_SnapSize = 0;
      in_RDI->m_aSnapshots[0]->m_Tick = -1;
      in_RDI->m_aSnapshots[1]->m_pSnap = (CSnapshot *)(in_RDI->m_aDemorecSnapshotData + 1);
      in_RDI->m_aSnapshots[1]->m_pAltSnap = (CSnapshot *)(in_RDI->m_aDemorecSnapshotData[1] + 1);
      in_RDI->m_aSnapshots[1]->m_SnapSize = 0;
      in_RDI->m_aSnapshots[1]->m_Tick = -1;
      SetState(in_RSI,(int)((ulong)block >> 0x20));
      CDemoPlayer::Play((CDemoPlayer *)CONCAT44(uVar1,in_EDX));
      pIVar2 = GameClient(in_RDI);
      (*(pIVar2->super_IInterface)._vptr_IInterface[7])();
      pCVar3 = (CClient *)0x0;
    }
    else {
      DisconnectWithReason(pCVar3,(char *)CONCAT44(uVar1,in_EDX));
    }
  }
  return (char *)pCVar3;
}

Assistant:

const char *CClient::DemoPlayer_Play(const char *pFilename, int StorageType)
{
	Disconnect();
	m_NetClient.ResetErrorString();

	// try to start playback
	m_DemoPlayer.SetListener(this);

	const char *pError = m_DemoPlayer.Load(pFilename, StorageType, GameClient()->NetVersion());
	if(pError)
		return pError;

	// load map
	const unsigned Crc = bytes_be_to_uint(m_DemoPlayer.Info()->m_Header.m_aMapCrc);
	pError = LoadMapSearch(m_DemoPlayer.Info()->m_Header.m_aMapName, 0, Crc);
	if(pError)
	{
		DisconnectWithReason(pError);
		return pError;
	}

	GameClient()->OnConnected();

	// setup buffers
	mem_zero(m_aDemorecSnapshotData, sizeof(m_aDemorecSnapshotData));

	m_aSnapshots[SNAP_CURRENT] = &m_aDemorecSnapshotHolders[SNAP_CURRENT];
	m_aSnapshots[SNAP_PREV] = &m_aDemorecSnapshotHolders[SNAP_PREV];

	m_aSnapshots[SNAP_CURRENT]->m_pSnap = (CSnapshot *)m_aDemorecSnapshotData[SNAP_CURRENT][0];
	m_aSnapshots[SNAP_CURRENT]->m_pAltSnap = (CSnapshot *)m_aDemorecSnapshotData[SNAP_CURRENT][1];
	m_aSnapshots[SNAP_CURRENT]->m_SnapSize = 0;
	m_aSnapshots[SNAP_CURRENT]->m_Tick = -1;

	m_aSnapshots[SNAP_PREV]->m_pSnap = (CSnapshot *)m_aDemorecSnapshotData[SNAP_PREV][0];
	m_aSnapshots[SNAP_PREV]->m_pAltSnap = (CSnapshot *)m_aDemorecSnapshotData[SNAP_PREV][1];
	m_aSnapshots[SNAP_PREV]->m_SnapSize = 0;
	m_aSnapshots[SNAP_PREV]->m_Tick = -1;

	// enter demo playback state
	SetState(IClient::STATE_DEMOPLAYBACK);

	m_DemoPlayer.Play();
	GameClient()->OnEnterGame();

	return 0;
}